

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

int lookup_flag(char **flag_table,char *flag_name)

{
  int iVar1;
  long lVar2;
  
  for (lVar2 = 1; flag_table[lVar2] != (char *)0x0; lVar2 = lVar2 + 1) {
    iVar1 = strcmp(flag_table[lVar2],flag_name);
    if (iVar1 == 0) goto LAB_00136c61;
  }
  lVar2 = 0;
LAB_00136c61:
  return (int)lVar2;
}

Assistant:

int lookup_flag(const char **flag_table, const char *flag_name) {
	int i = FLAG_START;

	while (flag_table[i] && !streq(flag_table[i], flag_name))
		i++;

	/* End of table reached without match */
	if (!flag_table[i]) i = FLAG_END;

	return i;
}